

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O3

string * __thiscall
Json::valueToString_abi_cxx11_(string *__return_storage_ptr__,Json *this,double value)

{
  byte *pbVar1;
  size_t sVar2;
  byte *pbVar3;
  byte *pbVar4;
  byte *pbVar5;
  char buffer [32];
  undefined8 uStack_40;
  byte local_38 [40];
  
  uStack_40 = 0x14bae2;
  sprintf((char *)local_38,"%#.16g");
  uStack_40 = 0x14baea;
  sVar2 = strlen((char *)local_38);
  if (local_38[sVar2 - 1] == 0x30) {
    pbVar4 = local_38 + (sVar2 - 1);
    if (local_38 < pbVar4) {
      pbVar1 = local_38 + (sVar2 - 2);
      do {
        pbVar3 = pbVar1;
        pbVar4 = local_38;
        pbVar5 = local_38;
        if (pbVar3 <= local_38) break;
        pbVar4 = pbVar3;
        pbVar1 = pbVar3 + -1;
        pbVar5 = pbVar3;
      } while (*pbVar3 == 0x30);
    }
    else {
      pbVar5 = pbVar4;
      if (pbVar4 < local_38) goto LAB_0014bb37;
    }
    do {
      if (9 < *pbVar4 - 0x30) {
        if (*pbVar4 == 0x2e) {
          pbVar5[2] = 0;
        }
        break;
      }
      pbVar4 = pbVar4 + -1;
    } while (local_38 <= pbVar4);
  }
LAB_0014bb37:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  uStack_40 = 0x14bb49;
  sVar2 = strlen((char *)local_38);
  uStack_40 = 0x14bb58;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,local_38,local_38 + sVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string valueToString( double value )
{
   char buffer[32];
#if defined(_MSC_VER) && defined(__STDC_SECURE_LIB__) // Use secure version with visual studio 2005 to avoid warning. 
   sprintf_s(buffer, sizeof(buffer), "%#.16g", value); 
#else	
   sprintf(buffer, "%#.16g", value); 
#endif
   char* ch = buffer + strlen(buffer) - 1;
   if (*ch != '0') return buffer; // nothing to truncate, so save time
   while(ch > buffer && *ch == '0'){
     --ch;
   }
   char* last_nonzero = ch;
   while(ch >= buffer){
     switch(*ch){
     case '0':
     case '1':
     case '2':
     case '3':
     case '4':
     case '5':
     case '6':
     case '7':
     case '8':
     case '9':
       --ch;
       continue;
     case '.':
       // Truncate zeroes to save bytes in output, but keep one.
       *(last_nonzero+2) = '\0';
       return buffer;
     default:
       return buffer;
     }
   }
   return buffer;
}